

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinusoidal_linear_chirp_source.cc
# Opt level: O0

void __thiscall
webrtc::SinusoidalLinearChirpSource::Run
          (SinusoidalLinearChirpSource *this,size_t frames,float *destination)

{
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double t;
  size_t i;
  float *destination_local;
  size_t frames_local;
  SinusoidalLinearChirpSource *this_local;
  
  t = 0.0;
  while ((ulong)t < frames) {
    dVar2 = Frequency(this,this->current_index_);
    if (dVar2 <= (double)this->sample_rate_ * 0.5) {
      sVar1 = this->current_index_;
      auVar4._8_4_ = (int)(sVar1 >> 0x20);
      auVar4._0_8_ = sVar1;
      auVar4._12_4_ = 0x45300000;
      if (this->delay_samples_ <=
          (auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) {
        sVar1 = this->current_index_;
        auVar3._8_4_ = (int)(sVar1 >> 0x20);
        auVar3._0_8_ = sVar1;
        auVar3._12_4_ = 0x45300000;
        dVar2 = (((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) -
                this->delay_samples_) / (double)this->sample_rate_;
        dVar2 = sin((dVar2 * 5.0 + (this->k_ / 2.0) * dVar2 * dVar2) * 6.283185307179586);
        destination[(long)t] = (float)dVar2;
      }
      else {
        destination[(long)t] = 0.0;
      }
    }
    else {
      destination[(long)t] = 0.0;
    }
    t = (double)((long)t + 1);
    this->current_index_ = this->current_index_ + 1;
  }
  return;
}

Assistant:

void SinusoidalLinearChirpSource::Run(size_t frames, float* destination) {
  for (size_t i = 0; i < frames; ++i, ++current_index_) {
    // Filter out frequencies higher than Nyquist.
    if (Frequency(current_index_) > 0.5 * sample_rate_) {
      destination[i] = 0;
    } else {
      // Calculate time in seconds.
      if (current_index_ < delay_samples_) {
        destination[i] = 0;
      } else {
        // Sinusoidal linear chirp.
        double t = (current_index_ - delay_samples_) / sample_rate_;
        destination[i] =
            sin(2 * M_PI * (kMinFrequency * t + (k_ / 2) * t * t));
      }
    }
  }
}